

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O2

Program * parse_program(char **base_source_names)

{
  Map *types;
  size_t sVar1;
  Queue *q;
  Program *program;
  Linkage *internal_linkage;
  Translation_Data *translation_data;
  Source_File *src;
  AST *data;
  char **ppcVar2;
  char *filename;
  char *this_directory [2];
  char *local_38;
  undefined8 uStack_30;
  
  local_38 = "./";
  uStack_30 = 0;
  if (base_source_names != (char **)0x0) {
    if (*base_source_names == (char *)0x0) {
      program = (Program *)0x0;
    }
    else {
      program = get_program();
      types = program->types;
      internal_linkage = get_linkage();
      translation_data = get_translation_data(types,internal_linkage,program->external_linkage);
      filename = *base_source_names;
      ppcVar2 = base_source_names + 1;
      do {
        src = get_source_file(filename,&local_38);
        if (src != (Source_File *)0x0) {
          Queue_Push(translation_data->source_files,src);
          lex(src,translation_data);
          sVar1 = translation_data->errors->size;
          if (sVar1 == translation_data->number_of_errors_when_last_checked) {
            q = program->translation_units;
            data = parse_translation_unit(translation_data);
            Queue_Push(q,data);
          }
          else {
            translation_data->number_of_errors_when_last_checked = sVar1;
            flush_tokens(translation_data->tokens);
          }
          assimilate_translation_data(program,translation_data);
        }
        filename = *ppcVar2;
        ppcVar2 = ppcVar2 + 1;
      } while (filename != (char *)0x0);
      delete_translation_data(translation_data);
    }
    return program;
  }
  __assert_fail("base_source_names!=NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/program/program.c"
                ,0xb7,"struct Program *parse_program(char **)");
}

Assistant:

struct Program* parse_program(char **base_source_names)
{
	struct Source_File *base_file;
	struct Program *program;
	struct Translation_Data *hold_translation_data;
	char *this_directory[]={"./",NULL};

	assert(base_source_names!=NULL);

	if(*base_source_names==NULL)
	{
		return NULL;
	}

	program=get_program();
	hold_translation_data=get_translation_data(program->types,get_linkage(),program->external_linkage);	
	do
	{
		base_file=get_source_file(*base_source_names,this_directory);
		if(base_file==NULL)
		{
			/*TODO error*/
			free(base_file);
			continue;
		}else
		{
			Queue_Push(hold_translation_data->source_files,base_file);
			lex(base_file,hold_translation_data);
			if(!has_new_errors(hold_translation_data))
			{
				Queue_Push(program->translation_units,parse_translation_unit(hold_translation_data));
			}else
			{
				flush_tokens(hold_translation_data->tokens);
			}
			assimilate_translation_data(program,hold_translation_data);
		}
	}while(*(++base_source_names));
	
	delete_translation_data(hold_translation_data);	
	return program;
}